

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

char * read_cstring(lua_State *L,bson_reader *br,size_t *sz)

{
  uint8_t *puVar1;
  char *r;
  int i;
  size_t *sz_local;
  bson_reader *br_local;
  lua_State *L_local;
  
  r._4_4_ = 0;
  while( true ) {
    if (r._4_4_ == br->size) {
      luaL_error(L,"Invalid bson block : cstring");
    }
    if (br->ptr[r._4_4_] == '\0') break;
    r._4_4_ = r._4_4_ + 1;
  }
  *sz = (long)r._4_4_;
  puVar1 = br->ptr;
  br->ptr = br->ptr + (r._4_4_ + 1);
  br->size = br->size - (r._4_4_ + 1);
  return (char *)puVar1;
}

Assistant:

static inline const char *
read_cstring(lua_State *L, struct bson_reader *br, size_t *sz) {
	int i;
	for (i=0;;i++) {
		if (i==br->size) {
			luaL_error(L, "Invalid bson block : cstring");
		}
		if (br->ptr[i] == '\0') {
			break;
		}
	}
	*sz = i;
	const char * r = (const char *)br->ptr;
	br->ptr += i+1;
	br->size -= i+1;
	return r;
}